

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getFinalAddress<wasm::AtomicCmpxchg>
          (ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicCmpxchg *curr,Literal *ptr,Index bytes,
          Address memorySize)

{
  uint64_t lhs;
  bool bVar1;
  int32_t iVar2;
  address64_t aVar3;
  address64_t aVar4;
  ulong lhs_00;
  uint64_t local_78;
  Address local_58;
  BasicType local_4c;
  uint64_t local_48;
  uint64_t addr;
  Address memorySizeBytes;
  Index bytes_local;
  Literal *ptr_local;
  AtomicCmpxchg *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Address memorySize_local;
  
  memorySizeBytes.addr._4_4_ = bytes;
  this_local = (ModuleRunnerBase<wasm::ModuleRunner> *)memorySize.addr;
  aVar3 = Address::operator_cast_to_unsigned_long((Address *)&this_local);
  Address::Address((Address *)&addr,aVar3 << 0x10);
  local_4c = i32;
  bVar1 = Type::operator==(&ptr->type,&local_4c);
  if (bVar1) {
    iVar2 = wasm::Literal::geti32(ptr);
    local_78 = (uint64_t)iVar2;
  }
  else {
    local_78 = wasm::Literal::geti64(ptr);
  }
  local_48 = local_78;
  aVar3 = Address::operator_cast_to_unsigned_long((Address *)(curr + 0x18));
  aVar4 = Address::operator_cast_to_unsigned_long((Address *)&addr);
  trapIfGt(this,aVar3,aVar4,"offset > memory");
  lhs = local_48;
  aVar3 = Address::operator_cast_to_unsigned_long((Address *)&addr);
  aVar4 = Address::operator_cast_to_unsigned_long((Address *)(curr + 0x18));
  trapIfGt(this,lhs,aVar3 - aVar4,"final > memory");
  aVar3 = Address::operator_cast_to_unsigned_long((Address *)(curr + 0x18));
  local_48 = aVar3 + local_48;
  lhs_00 = (ulong)memorySizeBytes.addr._4_4_;
  aVar3 = Address::operator_cast_to_unsigned_long((Address *)&addr);
  trapIfGt(this,lhs_00,aVar3,"bytes > memory");
  Address::Address(&local_58,local_48);
  checkLoadAddress(this,local_58,memorySizeBytes.addr._4_4_,(Address)this_local);
  Address::Address(&memorySize_local,local_48);
  return (Address)memorySize_local.addr;
}

Assistant:

Address
  getFinalAddress(LS* curr, Literal ptr, Index bytes, Address memorySize) {
    Address memorySizeBytes = memorySize * Memory::kPageSize;
    uint64_t addr = ptr.type == Type::i32 ? ptr.geti32() : ptr.geti64();
    trapIfGt(curr->offset, memorySizeBytes, "offset > memory");
    trapIfGt(addr, memorySizeBytes - curr->offset, "final > memory");
    addr += curr->offset;
    trapIfGt(bytes, memorySizeBytes, "bytes > memory");
    checkLoadAddress(addr, bytes, memorySize);
    return addr;
  }